

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O3

olsrv2_tc_edge * olsrv2_tc_edge_add(olsrv2_tc_node *src,netaddr *addr)

{
  long lVar1;
  olsrv2_tc_edge *poVar2;
  olsrv2_tc_edge *poVar3;
  olsrv2_tc_node *poVar4;
  
  lVar1 = avl_find(&src->_edges);
  if (lVar1 == 0) {
    poVar3 = (olsrv2_tc_edge *)oonf_class_malloc(&_tc_edge_class);
    if (poVar3 != (olsrv2_tc_edge *)0x0) {
      poVar2 = (olsrv2_tc_edge *)oonf_class_malloc(&_tc_edge_class);
      if (poVar2 != (olsrv2_tc_edge *)0x0) {
        lVar1 = avl_find(&_tc_tree);
        if (lVar1 == 0) {
          poVar4 = olsrv2_tc_node_add(addr,0,0);
          if (poVar4 == (olsrv2_tc_node *)0x0) {
            oonf_class_free(&_tc_edge_class,poVar3);
            poVar3 = poVar2;
            goto LAB_00108774;
          }
        }
        else {
          poVar4 = (olsrv2_tc_node *)(lVar1 + -0x150);
        }
        poVar3->src = src;
        poVar3->dst = poVar4;
        poVar3->inverse = poVar2;
        poVar3->cost[0] = 0xffffff;
        poVar3->cost[1] = 0xffffff;
        poVar3->cost[2] = 0xffffff;
        poVar3->cost[3] = 0xffffff;
        (poVar3->_node).key = poVar4;
        avl_insert(&src->_edges,&poVar3->_node);
        poVar2->src = poVar4;
        poVar2->dst = src;
        poVar2->inverse = poVar3;
        poVar2->virtual = true;
        poVar2->cost[0] = 0xffffff;
        poVar2->cost[1] = 0xffffff;
        poVar2->cost[2] = 0xffffff;
        poVar2->cost[3] = 0xffffff;
        (poVar2->_node).key = src;
        avl_insert(&poVar4->_edges,&poVar2->_node);
        goto LAB_0010870c;
      }
LAB_00108774:
      oonf_class_free(&_tc_edge_class,poVar3);
    }
    poVar3 = (olsrv2_tc_edge *)0x0;
  }
  else {
    poVar3 = (olsrv2_tc_edge *)(lVar1 + -0x30);
    *(undefined1 *)(lVar1 + -6) = 0;
    *(undefined4 *)(lVar1 + -0x18) = 0xffffff;
    *(undefined4 *)(lVar1 + -0x14) = 0xffffff;
    *(undefined4 *)(lVar1 + -0x10) = 0xffffff;
    *(undefined4 *)(lVar1 + -0xc) = 0xffffff;
LAB_0010870c:
    oonf_class_event(&_tc_edge_class,poVar3,1);
  }
  return poVar3;
}

Assistant:

struct olsrv2_tc_edge *
olsrv2_tc_edge_add(struct olsrv2_tc_node *src, struct netaddr *addr) {
  struct olsrv2_tc_edge *edge = NULL, *inverse = NULL;
  struct olsrv2_tc_node *dst = NULL;
  int i;

  edge = avl_find_element(&src->_edges, addr, edge, _node);
  if (edge != NULL) {
    edge->virtual = false;

    /* cleanup metric data from other side of the edge */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      edge->cost[i] = RFC7181_METRIC_INFINITE;
    }

    /* fire event */
    oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
    return edge;
  }

  /* allocate edge */
  edge = oonf_class_malloc(&_tc_edge_class);
  if (edge == NULL) {
    return NULL;
  }

  /* allocate inverse edge */
  inverse = oonf_class_malloc(&_tc_edge_class);
  if (inverse == NULL) {
    oonf_class_free(&_tc_edge_class, edge);
    return NULL;
  }

  /* find or allocate destination node */
  dst = avl_find_element(&_tc_tree, addr, dst, _originator_node);
  if (dst == NULL) {
    /* create virtual node */
    dst = olsrv2_tc_node_add(addr, 0, 0);
    if (dst == NULL) {
      oonf_class_free(&_tc_edge_class, edge);
      oonf_class_free(&_tc_edge_class, inverse);
      return NULL;
    }
  }

  /* initialize edge */
  edge->src = src;
  edge->dst = dst;
  edge->inverse = inverse;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    edge->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook edge into src node */
  edge->_node.key = &dst->target.prefix.dst;
  avl_insert(&src->_edges, &edge->_node);

  /* initialize inverse (virtual) edge */
  inverse->src = dst;
  inverse->dst = src;
  inverse->inverse = edge;
  inverse->virtual = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    inverse->cost[i] = RFC7181_METRIC_INFINITE;
  }

  /* hook inverse edge into dst node */
  inverse->_node.key = &src->target.prefix.dst;
  avl_insert(&dst->_edges, &inverse->_node);

  /* fire event */
  oonf_class_event(&_tc_edge_class, edge, OONF_OBJECT_ADDED);
  return edge;
}